

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.cpp
# Opt level: O2

FILE * SJ_fopen(path *fname,char *mode)

{
  FILE *pFVar1;
  string local_38;
  
  pFVar1 = (FILE *)0x0;
  if ((mode != (char *)0x0) && ((fname->_M_pathname)._M_string_length != 0)) {
    std::filesystem::__cxx11::path::string(&local_38,fname);
    pFVar1 = fopen(local_38._M_dataplus._M_p,mode);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return (FILE *)pFVar1;
}

Assistant:

FILE* SJ_fopen(const std::filesystem::path & fname, const char* mode) {
	if (nullptr == mode || fname.empty()) return nullptr;
	return fopen(fname.string().c_str(), mode);
}